

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

void uv_sem_wait(uv_sem_t *sem)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  int *piVar2;
  
  if (platform_needs_custom_semaphore == 0) {
    do {
      iVar1 = sem_wait((sem_t *)sem);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
joined_r0x00788cba:
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    __mutex = *(pthread_mutex_t **)sem;
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 == 0) {
      do {
        if (*(int *)((long)__mutex + 0x58) != 0) {
          *(int *)((long)__mutex + 0x58) = *(int *)((long)__mutex + 0x58) + -1;
          iVar1 = pthread_mutex_unlock(__mutex);
          goto joined_r0x00788cba;
        }
        iVar1 = pthread_cond_wait((pthread_cond_t *)(__mutex + 1),__mutex);
      } while (iVar1 == 0);
    }
  }
  abort();
}

Assistant:

void uv_sem_wait(uv_sem_t* sem) {
  if (platform_needs_custom_semaphore)
    uv__custom_sem_wait(sem);
  else
    uv__sem_wait(sem);
}